

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon.c
# Opt level: O3

void JPCommon_clear(JPCommon *jpcommon)

{
  _JPCommonNode *p_Var1;
  JPCommonNode *node;
  
  node = jpcommon->head;
  while (node != (JPCommonNode *)0x0) {
    p_Var1 = node->next;
    JPCommonNode_clear(node);
    free(jpcommon->head);
    jpcommon->head = p_Var1;
    node = p_Var1;
  }
  jpcommon->tail = (JPCommonNode *)0x0;
  if (jpcommon->label != (JPCommonLabel *)0x0) {
    JPCommonLabel_clear(jpcommon->label);
    free(jpcommon->label);
  }
  jpcommon->label = (JPCommonLabel *)0x0;
  return;
}

Assistant:

void JPCommon_clear(JPCommon * jpcommon)
{
   JPCommonNode *node;

   while (jpcommon->head != NULL) {
      node = jpcommon->head->next;
      JPCommonNode_clear(jpcommon->head);
      free(jpcommon->head);
      jpcommon->head = node;
   }
   jpcommon->tail = NULL;

   if (jpcommon->label != NULL) {
      JPCommonLabel_clear(jpcommon->label);
      free(jpcommon->label);
   }
   jpcommon->label = NULL;
}